

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O2

QCursorData *
QCursorData::setBitmap(QBitmap *bitmap,QBitmap *mask,int hotX,int hotY,qreal devicePixelRatio)

{
  int iVar1;
  QSize QVar2;
  QSize QVar3;
  QCursorData *this;
  QBitmap *pQVar4;
  long in_FS_OFFSET;
  double dVar5;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  initialize();
  iVar1 = QPixmap::depth(&bitmap->super_QPixmap);
  if (iVar1 == 1) {
    iVar1 = QPixmap::depth(&mask->super_QPixmap);
    if (iVar1 == 1) {
      QVar2 = QPixmap::size(&bitmap->super_QPixmap);
      QVar3 = QPixmap::size(&mask->super_QPixmap);
      if (QVar2 == QVar3) {
        this = (QCursorData *)operator_new(0x38);
        QCursorData(this,ArrowCursor);
        pQVar4 = (QBitmap *)operator_new(0x18);
        QBitmap::QBitmap(pQVar4,bitmap);
        this->bm = pQVar4;
        pQVar4 = (QBitmap *)operator_new(0x18);
        QBitmap::QBitmap(pQVar4,mask);
        this->bmm = pQVar4;
        this->cshape = BitmapCursor;
        if (hotX < 0) {
          iVar1 = QPixmap::width(&bitmap->super_QPixmap);
          dVar5 = (double)(iVar1 / 2) / devicePixelRatio;
        }
        else {
          dVar5 = (double)hotX;
        }
        this->hx = (short)(int)dVar5;
        if (hotY < 0) {
          iVar1 = QPixmap::height(&bitmap->super_QPixmap);
          dVar5 = (double)(iVar1 / 2) / devicePixelRatio;
        }
        else {
          dVar5 = (double)hotY;
        }
        this->hy = (short)(int)dVar5;
        goto LAB_0029c52b;
      }
    }
  }
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_40 = "default";
  QMessageLogger::warning(local_58,"QCursor: Cannot create bitmap cursor; invalid bitmap(s)");
  this = qt_cursorTable[0];
  LOCK();
  (qt_cursorTable[0]->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (qt_cursorTable[0]->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
LAB_0029c52b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QCursorData *QCursorData::setBitmap(const QBitmap &bitmap, const QBitmap &mask, int hotX, int hotY, qreal devicePixelRatio)
{
    QCursorData::initialize();
    if (bitmap.depth() != 1 || mask.depth() != 1 || bitmap.size() != mask.size()) {
        qWarning("QCursor: Cannot create bitmap cursor; invalid bitmap(s)");
        QCursorData *c = qt_cursorTable[0];
        c->ref.ref();
        return c;
    }
    QCursorData *d = new QCursorData;
    d->bm  = new QBitmap(bitmap);
    d->bmm = new QBitmap(mask);
    d->cshape = Qt::BitmapCursor;
    d->hx = hotX >= 0 ? hotX : bitmap.width() / 2 / devicePixelRatio;
    d->hy = hotY >= 0 ? hotY : bitmap.height() / 2 / devicePixelRatio;

    return d;
}